

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spectrum_to_spectrum.cc
# Opt level: O3

bool __thiscall
sptk::SpectrumToSpectrum::Run
          (SpectrumToSpectrum *this,vector<double,_std::allocator<double>_> *input,
          vector<double,_std::allocator<double>_> *output)

{
  pointer __src;
  pointer ppOVar1;
  char cVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  size_type __new_size;
  pointer ppOVar5;
  
  if (this->is_valid_ != true) {
    return false;
  }
  cVar2 = '\0';
  if (output != (vector<double,_std::allocator<double>_> *)0x0) {
    lVar4 = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    __new_size = lVar4 >> 3;
    if (__new_size == (long)(this->fft_length_ / 2 + 1)) {
      if ((long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start != lVar4) {
        std::vector<double,_std::allocator<double>_>::resize(output,__new_size);
      }
      if (input != output) {
        __src = (input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start;
        __n = (long)(input->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish - (long)__src;
        if (__n != 0) {
          memmove((output->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_start,__src,__n);
        }
      }
      ppOVar1 = (this->operations_).
                super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (ppOVar1 ==
          (this->operations_).
          super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        cVar2 = '\x01';
      }
      else {
        do {
          ppOVar5 = ppOVar1 + 1;
          iVar3 = (*(*ppOVar1)->_vptr_OperationInterface[2])(*ppOVar1,output);
          cVar2 = (char)iVar3;
          if (cVar2 == '\0') {
            return false;
          }
          ppOVar1 = ppOVar5;
        } while (ppOVar5 !=
                 (this->operations_).
                 super__Vector_base<sptk::SpectrumToSpectrum::OperationInterface_*,_std::allocator<sptk::SpectrumToSpectrum::OperationInterface_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
    }
  }
  return (bool)cVar2;
}

Assistant:

bool SpectrumToSpectrum::Run(const std::vector<double>& input,
                             std::vector<double>* output) const {
  // Check inputs.
  const int length(fft_length_ / 2 + 1);
  if (!is_valid_ || input.size() != static_cast<std::size_t>(length) ||
      NULL == output) {
    return false;
  }

  // Prepare memories.
  if (output->size() != static_cast<std::size_t>(length)) {
    output->resize(length);
  }

  if (&input != output) {
    std::copy(input.begin(), input.end(), output->begin());
  }

  for (std::vector<SpectrumToSpectrum::OperationInterface*>::const_iterator itr(
           operations_.begin());
       itr != operations_.end(); ++itr) {
    if (!(*itr)->Run(output)) {
      return false;
    }
  }

  return true;
}